

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O0

URegistryKey __thiscall
icu_63::ICUService::registerInstance
          (ICUService *this,UObject *objToAdopt,UnicodeString *id,UBool visible,UErrorCode *status)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  undefined4 extraout_var_01;
  ICUServiceFactory *f;
  undefined1 local_80 [8];
  UnicodeString canonicalID;
  ICUServiceKey *key;
  UErrorCode *status_local;
  UBool visible_local;
  UnicodeString *id_local;
  UObject *objToAdopt_local;
  ICUService *this_local;
  undefined4 extraout_var_00;
  
  iVar1 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xd])(this,id,status);
  canonicalID.fUnion._48_8_ = CONCAT44(extraout_var,iVar1);
  if (canonicalID.fUnion._48_8_ != 0) {
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_80);
    (**(code **)(*(long *)canonicalID.fUnion._48_8_ + 0x20))
              (canonicalID.fUnion._48_8_,(UnicodeString *)local_80);
    if (canonicalID.fUnion._48_8_ != 0) {
      (**(code **)(*(long *)canonicalID.fUnion._48_8_ + 8))();
    }
    iVar1 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xf])
                      (this,objToAdopt,local_80,(ulong)(uint)(int)visible,status);
    lVar2 = CONCAT44(extraout_var_00,iVar1);
    if (lVar2 != 0) {
      iVar1 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[9])(this,lVar2,status);
      this_local = (ICUService *)CONCAT44(extraout_var_01,iVar1);
    }
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_80);
    if (lVar2 != 0) {
      return this_local;
    }
  }
  if (objToAdopt != (UObject *)0x0) {
    (*objToAdopt->_vptr_UObject[1])();
  }
  return (URegistryKey)0x0;
}

Assistant:

URegistryKey
ICUService::registerInstance(UObject* objToAdopt, const UnicodeString& id, UBool visible, UErrorCode& status) 
{
    ICUServiceKey* key = createKey(&id, status);
    if (key != NULL) {
        UnicodeString canonicalID;
        key->canonicalID(canonicalID);
        delete key;

        ICUServiceFactory* f = createSimpleFactory(objToAdopt, canonicalID, visible, status);
        if (f != NULL) {
            return registerFactory(f, status);
        }
    }
    delete objToAdopt;
    return NULL;
}